

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_string_radix_sort.h
# Opt level: O0

void __thiscall
parallel_string_radix_sort::ParallelStringRadixSort<const_unsigned_char_*>::Init
          (ParallelStringRadixSort<const_unsigned_char_*> *this,size_t max_elems)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  uchar **ppuVar4;
  uint8_t *puVar5;
  uint16_t *puVar6;
  size_t max_elems_local;
  ParallelStringRadixSort<const_unsigned_char_*> *this_local;
  
  DeleteAll(this);
  this->max_elems_ = max_elems;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = max_elems;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppuVar4 = (uchar **)operator_new__(uVar3);
  this->temp_ = ppuVar4;
  puVar5 = (uint8_t *)operator_new__(max_elems);
  this->letters8_ = puVar5;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = max_elems;
  uVar3 = SUB168(auVar2 * ZEXT816(2),0);
  if (SUB168(auVar2 * ZEXT816(2),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  puVar6 = (uint16_t *)operator_new__(uVar3);
  this->letters16_ = puVar6;
  if (((this->temp_ != (uchar **)0x0) && (this->letters8_ != (uint8_t *)0x0)) &&
     (this->letters16_ != (uint16_t *)0x0)) {
    return;
  }
  fprintf(_stderr,"CHECK Failed(%s:%d): %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/external/parallel_string_radix_sort.h"
          ,0xd7,"temp_ != NULL && letters8_ != NULL && letters16_ != NULL");
  exit(1);
}

Assistant:

void ParallelStringRadixSort<StringType>::Init(size_t max_elems) {
  DeleteAll();

  max_elems_ = max_elems;
  temp_ = new StringType[max_elems];
  letters8_ = new uint8_t[max_elems];
  letters16_ = new uint16_t[max_elems];
  PSRS_CHECK(temp_ != NULL && letters8_ != NULL && letters16_ != NULL);
}